

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _width,char _fill)

{
  ostream *this;
  undefined7 in_register_00000009;
  ostringstream out;
  long local_1a0 [3];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  this = std::operator<<((ostringstream *)local_1a0,
                         CONCAT71(in_register_00000009,_fill) & 0xffffffff);
  *(long *)(this + *(long *)(*(long *)this + -0x18) + 0x10) = (long)_width;
  std::ostream::operator<<(this,*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << _value;
    return out.str();
}